

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvRescale(CVodeMem cv_mem)

{
  realtype *in_RDI;
  int unaff_retaddr;
  int j;
  N_Vector *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  in_RDI[0xcd] = in_RDI[0x2b];
  for (iVar1 = 1; iVar1 <= *(int *)(in_RDI + 0x24); iVar1 = iVar1 + 1) {
    in_RDI[(long)iVar1 + 0xcd] = in_RDI[0x2b] * in_RDI[(long)(iVar1 + -1) + 0xcd];
  }
  N_VScaleVectorArray(unaff_retaddr,in_RDI,(N_Vector *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffe8);
  in_RDI[0x28] = in_RDI[0x2c] * in_RDI[0x2b];
  in_RDI[0x2a] = in_RDI[0x28];
  in_RDI[0x2c] = in_RDI[0x28];
  *(undefined4 *)(in_RDI + 0xac) = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j=1; j <= cv_mem->cv_q; j++)
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j-1];

  (void) N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                             cv_mem->cv_zn+1, cv_mem->cv_zn+1);

  cv_mem->cv_h = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon = 0;
}